

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

void fy_node_clear_meta_internal(fy_node *fyn)

{
  fy_token *pfVar1;
  byte bVar2;
  fy_token *pfVar3;
  
  if (fyn == (fy_node *)0x0) {
    return;
  }
  bVar2 = fyn->field_0x34 & 3;
  if (bVar2 == 2) {
    pfVar3 = (fyn->field_12).scalar;
    if (pfVar3 != (fy_token *)0x0 && pfVar3 != (fy_token *)&fyn->field_12) {
      do {
        pfVar1 = (fy_token *)(pfVar3->node).next;
        fy_node_clear_meta_internal(*(fy_node **)&pfVar3->type);
        fy_node_clear_meta_internal(*(fy_node **)&pfVar3->analyze_flags);
        if (pfVar1 == (fy_token *)&fyn->field_12) break;
        pfVar3 = pfVar1;
      } while (pfVar1 != (fy_token *)0x0);
    }
  }
  else if (bVar2 == 1) {
    pfVar3 = (fyn->field_12).scalar;
    if (pfVar3 != (fy_token *)0x0 && pfVar3 != (fy_token *)&fyn->field_12) {
      do {
        fy_node_clear_meta_internal((fy_node *)pfVar3);
        pfVar3 = (fy_token *)(pfVar3->node).next;
        if (pfVar3 == (fy_token *)&fyn->field_12) break;
      } while (pfVar3 != (fy_token *)0x0);
    }
  }
  fy_node_clear_meta(fyn);
  return;
}

Assistant:

static void fy_node_clear_meta_internal(struct fy_node *fyn) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp, *fynpi;

    if (!fyn)
        return;

    switch (fyn->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                fy_node_clear_meta_internal(fyni);
            }
            break;

        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp; fynp = fynpi) {

                fynpi = fy_node_pair_next(&fyn->mapping, fynp);

                fy_node_clear_meta_internal(fynp->key);
                fy_node_clear_meta_internal(fynp->value);
            }
            break;
    }

    fy_node_clear_meta(fyn);
}